

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O0

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeLinear>::ComputeSolutionHCurlT<double>
          (TPZCompElHCurl<pzshape::TPZShapeLinear> *this,TPZFMatrix<double> *phiHCurl,
          TPZFMatrix<double> *curlPhi,TPZSolVec<double> *sol,TPZSolVec<double> *curlSol)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  TPZCompMesh *pTVar5;
  TPZFMatrix<double> *this_00;
  int64_t iVar6;
  TPZManVector<double,_10> *pTVar7;
  TPZConnect *this_01;
  double *pdVar8;
  TPZVec<TPZManVector<double,_10>_> *in_RCX;
  long *in_RDX;
  long *in_RDI;
  TPZVec<TPZManVector<double,_10>_> *in_R8;
  int coord_1;
  int coord;
  long iSol_1;
  int jShape;
  int pos;
  int nShapeCon;
  int64_t conSeqN;
  TPZConnect *con;
  int iCon;
  int ishape;
  TPZBlock *block;
  long iSol;
  long numberSol;
  TPZFMatrix<double> *meshSol;
  int nConnects;
  int nVar;
  int curlDim;
  int dim;
  TPZCompEl *in_stack_00000120;
  double in_stack_ffffffffffffff38;
  TPZSolutionMatrix *in_stack_ffffffffffffff40;
  double in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff60;
  int iVar9;
  long local_98;
  int local_8c;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int64_t in_stack_ffffffffffffff80;
  double *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int iVar10;
  undefined4 in_stack_ffffffffffffff94;
  int iVar11;
  long local_50;
  
  plVar4 = (long *)(**(code **)(*in_RDI + 0xb8))();
  (**(code **)(*plVar4 + 0x78))();
  iVar2 = (**(code **)(*in_RDI + 0x90))();
  pTVar5 = TPZCompEl::Mesh(in_stack_00000120);
  TPZCompMesh::Solution(pTVar5);
  this_00 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(in_stack_ffffffffffffff40);
  iVar6 = TPZBaseMatrix::Cols((TPZBaseMatrix *)this_00);
  (*in_RCX->_vptr_TPZVec[3])(in_RCX,iVar6);
  (*in_R8->_vptr_TPZVec[3])(in_R8,iVar6);
  for (local_50 = 0; local_50 < iVar6; local_50 = local_50 + 1) {
    pTVar7 = TPZVec<TPZManVector<double,_10>_>::operator[](in_RCX,local_50);
    (*(pTVar7->super_TPZVec<double>)._vptr_TPZVec[3])(pTVar7,1);
    TPZVec<TPZManVector<double,_10>_>::operator[](in_RCX,local_50);
    TPZVec<double>::Fill
              ((TPZVec<double> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    pTVar7 = TPZVec<TPZManVector<double,_10>_>::operator[](in_R8,local_50);
    (*(pTVar7->super_TPZVec<double>)._vptr_TPZVec[3])(pTVar7,1);
    TPZVec<TPZManVector<double,_10>_>::operator[](in_R8,local_50);
    TPZVec<double>::Fill
              ((TPZVec<double> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  pTVar5 = TPZCompEl::Mesh(in_stack_00000120);
  TPZCompMesh::Block(pTVar5);
  iVar11 = 0;
  for (iVar10 = 0; iVar10 < iVar2; iVar10 = iVar10 + 1) {
    this_01 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,iVar10);
    TPZConnect::SequenceNumber(this_01);
    iVar3 = TPZBlock::Size((TPZBlock *)in_stack_ffffffffffffff40,
                           (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    TPZBlock::Position((TPZBlock *)in_stack_ffffffffffffff40,
                       (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    for (local_8c = 0; local_8c < iVar3; local_8c = local_8c + 1) {
      for (local_98 = 0; local_98 < iVar6; local_98 = local_98 + 1) {
        for (iVar9 = 0; iVar9 < 1; iVar9 = iVar9 + 1) {
          pdVar8 = TPZFMatrix<double>::operator()
                             ((TPZFMatrix<double> *)CONCAT44(iVar9,in_stack_ffffffffffffff60),
                              (int64_t)in_RDI,(int64_t)in_stack_ffffffffffffff50);
          dVar1 = *pdVar8;
          in_stack_ffffffffffffff50 =
               TPZFMatrix<double>::operator()
                         ((TPZFMatrix<double> *)CONCAT44(iVar9,in_stack_ffffffffffffff60),
                          (int64_t)in_RDI,(int64_t)in_stack_ffffffffffffff50);
          pTVar7 = TPZVec<TPZManVector<double,_10>_>::operator[](in_RCX,local_98);
          pdVar8 = TPZVec<double>::operator[](&pTVar7->super_TPZVec<double>,(long)iVar9);
          *pdVar8 = dVar1 * in_stack_ffffffffffffff50 + *pdVar8;
        }
        for (in_stack_ffffffffffffff60 = 0; in_stack_ffffffffffffff60 < 1;
            in_stack_ffffffffffffff60 = in_stack_ffffffffffffff60 + 1) {
          pdVar8 = TPZFMatrix<double>::operator()
                             ((TPZFMatrix<double> *)CONCAT44(iVar9,in_stack_ffffffffffffff60),
                              (int64_t)in_RDI,(int64_t)in_stack_ffffffffffffff50);
          in_stack_ffffffffffffff38 = *pdVar8;
          in_stack_ffffffffffffff40 =
               (TPZSolutionMatrix *)
               (**(code **)(*in_RDX + 0x108))(in_RDX,(long)in_stack_ffffffffffffff60,(long)iVar11);
          pTVar7 = TPZVec<TPZManVector<double,_10>_>::operator[](in_R8,local_98);
          pdVar8 = TPZVec<double>::operator[]
                             (&pTVar7->super_TPZVec<double>,(long)in_stack_ffffffffffffff60);
          *pdVar8 = in_stack_ffffffffffffff38 * (double)in_stack_ffffffffffffff40 + *pdVar8;
        }
      }
      iVar11 = iVar11 + 1;
    }
  }
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::ComputeSolutionHCurlT(
  const TPZFMatrix<REAL> &phiHCurl, const TPZFMatrix<REAL> &curlPhi,
    TPZSolVec<TVar> &sol, TPZSolVec<TVar> &curlSol)
{
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curlDim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nVar = this->Material()->NStateVariables();
    const int nConnects = this->NConnects();

    TPZFMatrix<TVar> &meshSol = this->Mesh()->Solution();

    long numberSol = meshSol.Cols();
#ifdef PZDEBUG
    if (numberSol != 1 || nVar != 1) {
        DebugStop();
    }
#endif

    sol.Resize(numberSol);
    curlSol.Resize(numberSol);

    for (long iSol = 0; iSol < numberSol; iSol++) {
        sol[iSol].Resize(dim);
        sol[iSol].Fill(0);
        curlSol[iSol].Resize(curlDim);
        curlSol[iSol].Fill(0);
    }

    TPZBlock &block = this->Mesh()->Block();
    int ishape = 0;
    for (int iCon = 0; iCon < nConnects; iCon++) {
        TPZConnect *con = &this->Connect(iCon);
        const auto conSeqN = con->SequenceNumber();
        const auto nShapeCon = block.Size(conSeqN);
        const auto pos = block.Position(conSeqN);

        for (int jShape = 0; jShape < nShapeCon; jShape++) {

            for (long iSol = 0; iSol < numberSol; iSol++) {
                for (int coord = 0; coord < dim; coord++) {
                    sol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * phiHCurl(ishape, coord);
                }
                for (int coord = 0; coord < curlDim; coord++) {
                    curlSol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * curlPhi.Get(coord, ishape);
                }
            }
            ishape++;
        }
    }
}